

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O2

string * __thiscall
Diligent::
FormatString<char[17],char_const*,char[57],Diligent::IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>,char[73]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [17],char **Args_1,
          char (*Args_2) [57],IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> *Args_3,
          char (*Args_4) [73])

{
  stringstream ss;
  stringstream local_1b8 [392];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[17],char_const*,char[57],Diligent::IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>,char[73]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [17])this,(char **)Args,(char (*) [57])Args_1,
             (IndexWrapper<unsigned_char,_Diligent::_DeviceContextIndexTag> *)Args_2,
             (char (*) [73])Args_3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}